

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

void Aig_ManPrintControlFanouts(Aig_Man_t *p)

{
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObj_00;
  int i;
  Aig_Obj_t *pObj_01;
  Aig_Obj_t *pObj_02;
  
  pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,p->nObjs[2] + -1);
  puts("Control signal:");
  Aig_ObjPrint(p,pObj);
  puts("\n");
  i = 0;
  do {
    if (p->vObjs->nSize <= i) {
      return;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,i);
    if ((pObj_00 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj_00->field_0x18 & 7) - 7)) {
      if (pObj_00 == pObj) {
        __assert_fail("pObj != pCtrl",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigUtil.c"
                      ,0x41e,"void Aig_ManPrintControlFanouts(Aig_Man_t *)");
      }
      pObj_01 = (Aig_Obj_t *)((ulong)pObj_00->pFanin0 & 0xfffffffffffffffe);
      pObj_02 = (Aig_Obj_t *)((ulong)pObj_00->pFanin1 & 0xfffffffffffffffe);
      if ((pObj == pObj_01) && ((*(uint *)&pObj_02->field_0x18 & 7) == 2)) {
        Aig_ObjPrint(p,pObj_00);
        putchar(10);
        Aig_ObjPrint(p,pObj_02);
        putchar(10);
        putchar(10);
      }
      if ((pObj == pObj_02) && ((*(uint *)&pObj_01->field_0x18 & 7) == 2)) {
        Aig_ObjPrint(p,pObj_00);
        putchar(10);
        Aig_ObjPrint(p,pObj_01);
        putchar(10);
        putchar(10);
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Aig_ManPrintControlFanouts( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pFanin0, * pFanin1, * pCtrl;
    int i;

    pCtrl = Aig_ManCi( p, Aig_ManCiNum(p) - 1 );

    printf( "Control signal:\n" );
    Aig_ObjPrint( p, pCtrl ); printf( "\n\n" );

    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        assert( pObj != pCtrl );
        pFanin0 = Aig_ObjFanin0(pObj);
        pFanin1 = Aig_ObjFanin1(pObj);
        if ( pFanin0 == pCtrl && Aig_ObjIsCi(pFanin1) )
        {
            Aig_ObjPrint( p, pObj ); printf( "\n" );
            Aig_ObjPrint( p, pFanin1 ); printf( "\n" );
            printf( "\n" );
        }
        if ( pFanin1 == pCtrl && Aig_ObjIsCi(pFanin0) )
        {
            Aig_ObjPrint( p, pObj ); printf( "\n" );
            Aig_ObjPrint( p, pFanin0 ); printf( "\n" );
            printf( "\n" );
        }
    }
}